

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall Assimp::FBX::FBXConverter::ConvertAnimations(FBXConverter *this)

{
  bool bVar1;
  FrameRate fp;
  FileGlobalSettings *pFVar2;
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  *this_00;
  reference ppAVar3;
  float fVar4;
  double dVar5;
  AnimationStack *stack;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  *__range2;
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  *animations;
  float custom;
  FrameRate fps;
  FBXConverter *this_local;
  
  pFVar2 = Document::GlobalSettings(this->doc);
  fp = FileGlobalSettings::TimeMode(pFVar2);
  pFVar2 = Document::GlobalSettings(this->doc);
  fVar4 = FileGlobalSettings::CustomFrameRate(pFVar2);
  dVar5 = FrameRateToDouble(fp,(double)fVar4);
  this->anim_fps = dVar5;
  this_00 = Document::AnimationStacks(this->doc);
  __end2 = std::
           vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
           ::begin(this_00);
  stack = (AnimationStack *)
          std::
          vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
          ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::AnimationStack_*const_*,_std::vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>_>
                                *)&stack);
    if (!bVar1) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::AnimationStack_*const_*,_std::vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>_>
              ::operator*(&__end2);
    ConvertAnimationStack(this,*ppAVar3);
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::AnimationStack_*const_*,_std::vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void FBXConverter::ConvertAnimations()
        {
            // first of all determine framerate
            const FileGlobalSettings::FrameRate fps = doc.GlobalSettings().TimeMode();
            const float custom = doc.GlobalSettings().CustomFrameRate();
            anim_fps = FrameRateToDouble(fps, custom);

            const std::vector<const AnimationStack*>& animations = doc.AnimationStacks();
            for (const AnimationStack* stack : animations) {
                ConvertAnimationStack(*stack);
            }
        }